

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

int uv_pipe_listen(uv_pipe_t *handle,int backlog,uv_connection_cb cb)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  iVar1 = (handle->io_watcher).fd;
  iVar2 = -0x16;
  if ((iVar1 != -1) && (handle->ipc == 0)) {
    iVar1 = listen(iVar1,backlog);
    if (iVar1 == 0) {
      handle->connection_cb = cb;
      (handle->io_watcher).cb = uv__server_io;
      uv__io_start(handle->loop,&handle->io_watcher,1);
      iVar2 = 0;
    }
    else {
      piVar3 = __errno_location();
      iVar2 = -*piVar3;
    }
  }
  return iVar2;
}

Assistant:

int uv_pipe_listen(uv_pipe_t* handle, int backlog, uv_connection_cb cb) {
  if (uv__stream_fd(handle) == -1)
    return UV_EINVAL;

  if (handle->ipc)
    return UV_EINVAL;

#if defined(__MVS__) || defined(__PASE__)
  /* On zOS, backlog=0 has undefined behaviour */
  /* On IBMi PASE, backlog=0 leads to "Connection refused" error */
  if (backlog == 0)
    backlog = 1;
  else if (backlog < 0)
    backlog = SOMAXCONN;
#endif

  if (listen(uv__stream_fd(handle), backlog))
    return UV__ERR(errno);

  handle->connection_cb = cb;
  handle->io_watcher.cb = uv__server_io;
  uv__io_start(handle->loop, &handle->io_watcher, POLLIN);
  return 0;
}